

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

bool __thiscall
QWidgetPrivate::removeFromFocusChain
          (QWidgetPrivate *this,FocusChainRemovalRules rules,FocusDirection direction)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  QDebug QVar4;
  bool bVar5;
  QDebug *this_00;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  undefined1 local_80 [8];
  QWidget local_78;
  undefined1 local_50 [8];
  QDebug local_48;
  QArrayData *local_40 [3];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)&this->field_0x8;
  bVar5 = isFocusChainConsistent(this);
  if (bVar5) {
    lVar2 = *(long *)&this->field_0x8;
    if ((*(long *)(*(long *)(lVar2 + 8) + 0x80) != lVar2) ||
       (*(long *)(*(long *)(lVar2 + 8) + 0x88) != lVar2)) {
      if (((uint)rules.super_QFlagsStorageHelper<QWidgetPrivate::FocusChainRemovalRule,_4>.
                 super_QFlagsStorage<QWidgetPrivate::FocusChainRemovalRule>.i & 1) != 0) {
        (**(code **)(*plVar1 + 0x198))(plVar1,direction == Next);
      }
      lVar2 = plVar1[1];
      lVar3 = *(long *)(lVar2 + 0x88);
      *(undefined8 *)(*(long *)(lVar3 + 8) + 0x80) = *(undefined8 *)(lVar2 + 0x80);
      *(long *)(*(long *)(*(long *)(lVar2 + 0x80) + 8) + 0x88) = lVar3;
      initFocusChain(this);
      lcWidgetFocus();
      bVar5 = true;
      if (((byte)lcWidgetFocus::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0)
      {
        local_78._8_1_ = (QPaintDevice)0x2;
        local_78._9_3_ = 0;
        local_78._12_4_ = 0;
        local_78.super_QPaintDevice = (QPaintDevice)0x0;
        local_78._17_3_ = 0;
        local_78._20_8_ = 0;
        local_78._28_4_ = 0;
        local_78.data = (QWidgetData *)lcWidgetFocus::category.name;
        QMessageLogger::debug();
        ::operator<<((Stream *)&local_48,(QWidget *)local_80);
        QVar4.stream = local_48.stream;
        QVar6.m_data = (storage_type *)0x19;
        QVar6.m_size = (qsizetype)local_40;
        QString::fromUtf8(QVar6);
        QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)local_40);
        if (local_40[0] != (QArrayData *)0x0) {
          LOCK();
          (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_40[0],2,0x10);
          }
        }
        if (*(QTextStream *)(local_48.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_48.stream,' ');
        }
        QDebug::~QDebug(&local_48);
        QDebug::~QDebug((QDebug *)local_80);
      }
      goto LAB_002fb0ad;
    }
    lcWidgetFocus();
    if (((byte)lcWidgetFocus::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_78._8_1_ = (QPaintDevice)0x2;
      local_78._9_3_ = 0;
      local_78._12_4_ = 0;
      local_78.super_QPaintDevice = (QPaintDevice)0x0;
      local_78._17_3_ = 0;
      local_78._20_8_ = 0;
      local_78._28_4_ = 0;
      local_78.data = (QWidgetData *)lcWidgetFocus::category.name;
      QMessageLogger::debug();
      ::operator<<((Stream *)&local_48,(QWidget *)(local_80 + 8));
      QVar4.stream = local_48.stream;
      QVar8.m_data = (storage_type *)0x38;
      QVar8.m_size = (qsizetype)local_40;
      QString::fromUtf8(QVar8);
      QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)local_40);
      if (local_40[0] != (QArrayData *)0x0) {
        LOCK();
        (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_40[0],2,0x10);
        }
      }
      if (*(QTextStream *)(local_48.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_48.stream,' ');
      }
      QDebug::~QDebug(&local_48);
      this_00 = (QDebug *)(local_80 + 8);
      goto LAB_002fb0a6;
    }
  }
  else {
    lcWidgetFocus();
    if (((byte)lcWidgetFocus::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_78._8_1_ = (QPaintDevice)0x2;
      local_78._9_3_ = 0;
      local_78._12_4_ = 0;
      local_78.super_QPaintDevice = (QPaintDevice)0x0;
      local_78._17_3_ = 0;
      local_78._20_8_ = 0;
      local_78._28_4_ = 0;
      local_78.data = (QWidgetData *)lcWidgetFocus::category.name;
      QMessageLogger::debug();
      ::operator<<((Stream *)&local_48,(QWidget *)local_50);
      QVar4.stream = local_48.stream;
      QVar7.m_data = (storage_type *)0x34;
      QVar7.m_size = (qsizetype)local_40;
      QString::fromUtf8(QVar7);
      QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)local_40);
      if (local_40[0] != (QArrayData *)0x0) {
        LOCK();
        (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_40[0],2,0x10);
        }
      }
      if (*(QTextStream *)(local_48.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_48.stream,' ');
      }
      QDebug::~QDebug(&local_48);
      this_00 = (QDebug *)local_50;
LAB_002fb0a6:
      QDebug::~QDebug(this_00);
    }
  }
  bVar5 = false;
LAB_002fb0ad:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QWidgetPrivate::removeFromFocusChain(FocusChainRemovalRules rules, FocusDirection direction)
{
    Q_Q(QWidget);
    if (!isFocusChainConsistent()) {
#ifdef QT_DEBUG
        if (rules.testFlag(FocusChainRemovalRule::AssertConsistency))
            qFatal() << q << "has inconsistent focus chain.";
#endif
        qCDebug(lcWidgetFocus) << q << "wasn't removed, because of inconsistent focus chain.";
        return false;
    }

    if (!isInFocusChain()) {
        qCDebug(lcWidgetFocus) << q << "wasn't removed, because it is not part of a focus chain.";
        return false;
    }

    if (rules.testFlag(FocusChainRemovalRule::EnsureFocusOut))
        q->focusNextPrevChild(direction == FocusDirection::Next);

    FOCUS_NEXT(FOCUS_PREV(q)) = FOCUS_NEXT(q);
    FOCUS_PREV(FOCUS_NEXT(q)) = FOCUS_PREV(q);
    initFocusChain();
    qCDebug(lcWidgetFocus) << q << "removed from focus chain.";
    return true;
}